

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_13e445::BuildFileImpl::error(BuildFileImpl *this,StringRef message)

{
  BuildFileDelegate *pBVar1;
  pointer pcVar2;
  size_type sVar3;
  BuildFileToken atToken;
  StringRef local_68;
  undefined8 local_58;
  undefined4 local_50;
  Twine local_48;
  
  local_68.Length = message.Length;
  local_68.Data = message.Data;
  local_58 = 0;
  local_50 = 0;
  pBVar1 = this->delegate;
  pcVar2 = (this->mainFilename)._M_dataplus._M_p;
  sVar3 = (this->mainFilename)._M_string_length;
  llvm::Twine::Twine(&local_48,&local_68);
  (*pBVar1->_vptr_BuildFileDelegate[5])(pBVar1,pcVar2,sVar3,&local_58,&local_48);
  this->numErrors = this->numErrors + 1;
  return;
}

Assistant:

void error(StringRef message) {
    error(mainFilename, {}, message);
  }